

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codedump.c
# Opt level: O1

uintptr_t find_init_task_from_systemmap(char *map)

{
  FILE *__stream;
  char *pcVar1;
  ulong uVar2;
  char buf [4096];
  char acStack_1028 [4104];
  
  __stream = fopen(map,"r");
  if (__stream == (FILE *)0x0) {
    perror("fopen");
    uVar2 = 0;
  }
  else {
    pcVar1 = fgets(acStack_1028,0x1000,__stream);
    uVar2 = 0;
    while (pcVar1 != (char *)0x0) {
      pcVar1 = strstr(acStack_1028,"D init_task");
      if (pcVar1 != (char *)0x0) {
        pcVar1 = strchr(acStack_1028,0x20);
        *pcVar1 = '\0';
        uVar2 = strtoul(acStack_1028,(char **)0x0,0x10);
      }
      pcVar1 = fgets(acStack_1028,0x1000,__stream);
    }
    fclose(__stream);
  }
  return uVar2;
}

Assistant:

uintptr_t find_init_task_from_systemmap(char *map)
{
	FILE *fp;
	char buf[4096];
	uintptr_t addr = 0;

	fp = fopen(map, "r");
	if (!fp) {
		perror("fopen");
		return 0;
	}

	while(fgets(buf, sizeof(buf), fp) != NULL) {
		if (strstr(buf, "D init_task")) {
			char *p;
			p = strchr(buf, ' ');
			*p = '\0';
			addr = strtoul(buf, NULL, 16);
		}
	}

	fclose(fp);

	return addr;
}